

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_s256_256_1280(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined8 *puVar1;
  undefined1 auVar2 [64];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 local_100 [64];
  undefined1 auStack_c0 [32];
  undefined1 local_a0 [32];
  undefined1 auStack_80 [32];
  
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  auVar2 = vmovdqu64_avx512f(auVar12);
  auStack_80 = auVar2._32_32_;
  auVar2 = vmovdqa64_avx512f(auVar12);
  auStack_c0 = auVar2._0_32_;
  local_a0 = auVar2._32_32_;
  local_100 = vmovdqa64_avx512f(auVar12);
  iVar6 = 4;
  while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
    iVar7 = 0x40;
    while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
      auVar10 = vpbroadcastq_avx512vl();
      for (lVar8 = 0; lVar8 != 0xa0; lVar8 = lVar8 + 0x20) {
        auVar11 = vpternlogq_avx512vl(*(undefined1 (*) [32])((long)A->w64 + lVar8),auVar10,
                                      *(undefined1 (*) [32])(local_100 + lVar8),0x6a);
        *(undefined1 (*) [32])(local_100 + lVar8) = auVar11;
      }
      A = A + 5;
    }
  }
  for (lVar8 = 0; lVar8 != 0xa0; lVar8 = lVar8 + 0x20) {
    uVar3 = *(undefined8 *)(local_100 + lVar8 + 8);
    uVar4 = *(undefined8 *)(local_100 + lVar8 + 0x10);
    uVar5 = *(undefined8 *)(local_100 + lVar8 + 0x18);
    puVar1 = (undefined8 *)((long)c->w64 + lVar8);
    *puVar1 = *(undefined8 *)(local_100 + lVar8);
    puVar1[1] = uVar3;
    puVar1[2] = uVar4;
    puVar1[3] = uVar5;
  }
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_s256_256_1280(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[5] = {mm256_zero, mm256_zero, mm256_zero, mm256_zero, mm256_zero};
  for (unsigned int w = 4; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1) {
      const word256 mask = mm256_compute_mask(idx, 0);
      for (unsigned int j = 0; j < 5; ++j, ++Ablock) {
        cval[j] = mm256_xor_mask(cval[j], mm256_load(Ablock->w64), mask);
      }
    }
  }

  for (unsigned int j = 0; j < 5; ++j) {
    mm256_store(BLOCK(c, j)->w64, cval[j]);
  }
}